

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

int __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
::ReadNumArgs(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
              *this,int min_args)

{
  int in_ESI;
  TextReader<fmt::Locale> *in_stack_00000008;
  CStringRef in_stack_00000010;
  int num_args;
  BasicCStringRef<char> local_18;
  int local_10;
  int local_c;
  
  local_c = in_ESI;
  local_10 = TextReader<fmt::Locale>::ReadUInt((TextReader<fmt::Locale> *)0x1ac20f);
  if (local_10 < local_c) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_18,"too few arguments");
    TextReader<fmt::Locale>::ReportError<>(in_stack_00000008,in_stack_00000010);
  }
  return local_10;
}

Assistant:

int ReadNumArgs(int min_args = MIN_ITER_ARGS) {
    int num_args = reader_.ReadUInt();
    if (num_args < min_args)
      reader_.ReportError("too few arguments");
    return num_args;
  }